

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64assembler.cpp
# Opt level: O2

bool asmjit::v1_14::a64::armCheckMemBaseIndexRel(Mem *mem)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (mem->super_BaseMem).super_Operand.super_Operand_._signature._bits;
  if ((0x83U >> (uVar1 >> 3 & 0x1f) & 1) == 0) {
    return false;
  }
  uVar2 = uVar1 >> 8;
  if ((uVar1 & 0xf0) == 0) {
    uVar2 = uVar2 & 0x1f;
  }
  else {
    if ((0xc1U >> (uVar2 & 0x1f) & 1) == 0) {
      return false;
    }
    if ((uVar2 & 0x1f) == 0) {
      return true;
    }
    uVar2 = (mem->super_BaseMem).super_Operand.super_Operand_._data[1];
  }
  return uVar2 == 0;
}

Assistant:

static inline bool armCheckMemBaseIndexRel(const Mem& mem) noexcept {
  // Allowed base types (Nothing, Label, and GpX).
  constexpr uint32_t kBaseMask  = B(0) |
                                  B(RegType::kLabelTag) |
                                  B(RegType::kARM_GpX);

  // Allowed index types (Nothing, GpW, and GpX).
  constexpr uint32_t kIndexMask = B(0) |
                                  B(RegType::kARM_GpW) |
                                  B(RegType::kARM_GpX) ;

  RegType baseType = mem.baseType();
  RegType indexType = mem.indexType();

  if (!Support::bitTest(kBaseMask, baseType))
    return false;

  if (baseType > RegType::kLabelTag) {
    // Index allows either GpW or GpX.
    if (!Support::bitTest(kIndexMask, indexType))
      return false;

    if (indexType == RegType::kNone)
      return true;
    else
      return !mem.hasOffset();
  }
  else {
    // No index register allowed if this is a PC relative address (literal).
    return indexType == RegType::kNone;
  }
}